

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ArrayFeatureType_EnumeratedShapes::SerializeWithCachedSizes
          (ArrayFeatureType_EnumeratedShapes *this,CodedOutputStream *output)

{
  uint uVar1;
  ArrayFeatureType_Shape *value;
  undefined4 local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ArrayFeatureType_EnumeratedShapes *this_local;
  
  local_20 = 0;
  uVar1 = shapes_size(this);
  for (; local_20 < uVar1; local_20 = local_20 + 1) {
    value = shapes(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  return;
}

Assistant:

void ArrayFeatureType_EnumeratedShapes::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ArrayFeatureType.EnumeratedShapes)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ArrayFeatureType.Shape shapes = 1;
  for (unsigned int i = 0, n = this->shapes_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->shapes(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ArrayFeatureType.EnumeratedShapes)
}